

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O0

void dumpString(DumpState *D,TString *ts)

{
  byte bVar1;
  void *local_80;
  TValue *io_1;
  TString *x_;
  TValue *io;
  char *s;
  size_t size;
  TValue value;
  TValue key;
  Value VStack_28;
  int tag;
  TValue idx;
  TString *ts_local;
  DumpState *D_local;
  
  idx._8_8_ = ts;
  if (ts == (TString *)0x0) {
    dumpSize(D,0);
  }
  else {
    bVar1 = luaH_getstr(D->h,ts,(TValue *)&stack0xffffffffffffffd8);
    if ((bVar1 & 0xf) == 0) {
      if (*(char *)(idx._8_8_ + 0xb) < '\0') {
        s = *(char **)(idx._8_8_ + 0x10);
        local_80 = *(void **)(idx._8_8_ + 0x18);
      }
      else {
        s = (char *)(long)*(char *)(idx._8_8_ + 0xb);
        local_80 = (void *)(idx._8_8_ + 0x18);
      }
      dumpSize(D,(size_t)(s + 2));
      dumpBlock(D,local_80,(size_t)(s + 1));
      D->nstr = D->nstr + 1;
      value.tt_ = idx.tt_;
      value._9_7_ = idx._9_7_;
      size = D->nstr;
      value.value_.ub = '\x03';
      luaH_set(D->L,D->h,(TValue *)&value.tt_,(TValue *)&size);
    }
    else {
      dumpSize(D,1);
      dumpSize(D,VStack_28.i);
    }
  }
  return;
}

Assistant:

static void dumpString (DumpState *D, TString *ts) {
  if (ts == NULL)
    dumpSize(D, 0);
  else {
    TValue idx;
    int tag = luaH_getstr(D->h, ts, &idx);
    if (!tagisempty(tag)) {  /* string already saved? */
      dumpSize(D, 1);  /* reuse a saved string */
      dumpSize(D, cast_sizet(ivalue(&idx)));  /* index of saved string */
    }
    else {  /* must write and save the string */
      TValue key, value;  /* to save the string in the hash */
      size_t size;
      const char *s = getlstr(ts, size);
      dumpSize(D, size + 2);
      dumpVector(D, s, size + 1);  /* include ending '\0' */
      D->nstr++;  /* one more saved string */
      setsvalue(D->L, &key, ts);  /* the string is the key */
      setivalue(&value, D->nstr);  /* its index is the value */
      luaH_set(D->L, D->h, &key, &value);  /* h[ts] = nstr */
      /* integer value does not need barrier */
    }
  }
}